

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O3

double fas154x_seas(double *b,int pq,void *params)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  double *A;
  double *P;
  void *pvVar4;
  double *phi;
  int iVar5;
  int iVar6;
  double *pdVar7;
  size_t sVar8;
  ulong uVar9;
  double dVar10;
  ulong uVar11;
  double *pdVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  double dVar16;
  double extraout_XMM0_Qa;
  double local_b8;
  double ssq;
  double sumlog;
  long local_a0;
  double *local_98;
  double *local_90;
  int local_88;
  int local_84;
  int nit;
  int iter;
  ulong local_78;
  long local_70;
  void *local_68;
  double *local_60;
  double *local_58;
  double *local_50;
  long local_48;
  size_t local_40;
  double local_38;
  
  ssq = 0.0;
  local_b8 = 0.0;
  uVar14 = *params;
  local_70 = (long)(int)uVar14;
  local_38 = (double)(long)*(int *)((long)params + 0xc);
  uVar1 = *(uint *)((long)params + 8);
  local_78 = (ulong)*(uint *)((long)params + 0x10);
  _nit = (ulong)*(uint *)((long)params + 0x18);
  iVar5 = *(int *)((long)params + 0x1c);
  local_48 = (long)iVar5;
  sumlog = (double)(ulong)*(uint *)((long)params + 0x28);
  uVar2 = *(uint *)((long)params + 0x2c);
  local_a0 = (long)*(int *)((long)params + 0x50);
  local_40 = local_48 * 8;
  local_68 = params;
  local_60 = (double *)malloc(local_40);
  local_50 = (double *)malloc(local_40);
  local_98 = (double *)malloc(local_40);
  sVar8 = (long)(((iVar5 + 1) * iVar5) / 2) << 3;
  local_90 = (double *)malloc(sVar8);
  local_58 = (double *)malloc(sVar8);
  sVar8 = local_40;
  if (0 < local_48) {
    memset(local_60,0,local_40);
    memset(local_50,0,sVar8);
  }
  if (0 < (int)uVar14) {
    memcpy(local_60,b,(ulong)uVar14 * 8);
  }
  pdVar7 = b + local_70;
  if (0 < (int)uVar1) {
    memcpy(local_50,pdVar7,(ulong)uVar1 * 8);
  }
  phi = local_60;
  pvVar4 = local_68;
  P = local_90;
  A = local_98;
  iVar5 = (int)local_70 + uVar1;
  iVar13 = (int)local_78;
  if (0 < iVar13) {
    uVar9 = 0;
    pdVar12 = local_60;
    do {
      pdVar12 = pdVar12 + (long)local_38;
      dVar10 = b[(long)iVar5 + uVar9];
      uVar9 = uVar9 + 1;
      local_60[uVar9 * (long)local_38 + -1] = local_60[uVar9 * (long)local_38 + -1] + dVar10;
      if (0 < (int)uVar14) {
        uVar11 = 0;
        do {
          pdVar12[uVar11] = pdVar12[uVar11] - b[uVar11] * dVar10;
          uVar11 = uVar11 + 1;
        } while (uVar14 != uVar11);
      }
    } while (uVar9 != local_78);
  }
  iVar5 = iVar5 + iVar13;
  iVar6 = (int)_nit;
  iVar15 = SUB84(sumlog,0);
  local_48 = (long)iVar15;
  if (0 < iVar6) {
    uVar9 = 0;
    pdVar12 = local_50;
    do {
      pdVar12 = pdVar12 + (long)local_38;
      dVar10 = b[(long)iVar5 + uVar9];
      uVar9 = uVar9 + 1;
      local_50[uVar9 * (long)local_38 + -1] = local_50[uVar9 * (long)local_38 + -1] + dVar10;
      if (0 < (int)uVar1) {
        uVar11 = 0;
        do {
          pdVar12[uVar11] = pdVar7[uVar11] * dVar10 + pdVar12[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar1 != uVar11);
      }
    } while (uVar9 != _nit);
  }
  uVar14 = iVar13 * SUB84(local_38,0) + (int)local_70;
  local_78 = (ulong)uVar14;
  iVar13 = iVar6 * SUB84(local_38,0) + uVar1;
  local_40 = CONCAT44(local_40._4_4_,iVar13);
  if (0 < iVar15 && 0 < (int)uVar2) {
    pdVar7 = (double *)((long)local_68 + (long)(iVar15 * 3 + (int)local_a0) * 8 + 0x58);
    dVar10 = 0.0;
    do {
      dVar16 = *(double *)
                ((long)local_68 + ((long)dVar10 + (long)((int)local_a0 + iVar15 * 2)) * 8 + 0x58);
      uVar9 = 0;
      pdVar12 = pdVar7;
      do {
        dVar16 = dVar16 - *pdVar12 * b[(long)(iVar5 + iVar6) + uVar9];
        uVar9 = uVar9 + 1;
        pdVar12 = pdVar12 + (long)sumlog;
      } while (uVar2 != uVar9);
      *(double *)((long)local_68 + ((long)dVar10 + local_a0) * 8 + 0x58) = dVar16;
      dVar10 = (double)((long)dVar10 + 1);
      pdVar7 = pdVar7 + 1;
    } while (dVar10 != sumlog);
  }
  bVar3 = 1 < uVar14 || iVar13 != 0;
  if (bVar3) {
    starma(uVar14,iVar13,local_60,local_50,local_98,local_90,local_58);
    dVar10 = extraout_XMM0_Qa;
    iVar13 = (int)local_40;
  }
  else {
    *local_58 = 1.0;
    *local_98 = 0.0;
    dVar10 = *local_60 * *local_60;
    *local_90 = 1.0 / (1.0 - dVar10);
  }
  pdVar12 = local_58;
  local_38 = (double)(ulong)bVar3;
  local_88 = 0;
  pdVar7 = (double *)((long)pvVar4 + local_a0 * 8 + 0x58);
  karma(uVar14,iVar13,phi,&ssq,A,P,local_58,SUB84(sumlog,0),pdVar7,pdVar7 + local_48,&ssq,&local_b8,
        (uint)bVar3,dVar10,&local_84,&local_88);
  pvVar4 = local_68;
  *(double *)((long)local_68 + 0x40) = local_b8;
  local_38 = ssq / (double)local_84;
  dVar10 = log(local_b8 / (double)local_84);
  local_38 = (dVar10 + local_38) * 0.5;
  *(double *)((long)pvVar4 + 0x48) = local_38;
  free(phi);
  free(local_50);
  free(A);
  free(P);
  free(pdVar12);
  return local_38;
}

Assistant:

double fas154x_seas(double *b, int pq, void *params) {
	double value, ssq, sumlog, delta,temp;
	int p, q, ps, qs,s,offset,naram,M;
	int ip, iq, ir, i,j, np, ifault, N, iupd, nit, iter;
	double *phi, *theta, *A, *P, *V,*reg;

	value = ssq = sumlog = 0.0;
	xlik_object obj = (xlik_object)params;

	ip = obj->p + (obj->s * obj->P);
	iq = obj->q + (obj->s * obj->Q);
	ir = obj->r;
	N = obj->N;
	p = obj->p;
	ps = obj->P;
	q = obj->q;
	qs = obj->Q;
	M = obj->M;
	s = obj->s;
	offset = obj->offset;
	np = (ir * (ir + 1)) / 2;
	naram = p + q + ps + qs;
	reg = &obj->x[offset+3*N];
	//mdisplay(reg,M,N);

	phi = (double*)malloc(sizeof(double)* ir);
	theta = (double*)malloc(sizeof(double)* ir);
	A = (double*)malloc(sizeof(double)* ir);
	P = (double*)malloc(sizeof(double)* np);
	V = (double*)malloc(sizeof(double)* np);

	for (i = 0; i < ir; ++i) {
		phi[i] = 0.0;
		theta[i] = 0.0;
	}

	for (i = 0; i < p; ++i) {
		phi[i] = b[i];
	}

	for (i = 0; i < q; ++i) {
		theta[i] = b[i + p];
	}
	
	/*
	for (i = p; i < ip; ++i) {
		phi[i] = 0.0;
	}

	for (i = q; i < iq; ++i) {
		theta[i] = 0.0;
	}
	*/

	for (j = 0; j < ps; ++j) {
		phi[(j + 1)*s - 1] += b[p + q + j];
		for (i = 0; i < p; ++i) {
			phi[(j + 1)*s + i] -= b[i] * b[p + q + j];
		}
	}

	for (j = 0; j < qs; ++j) {
		theta[(j + 1)*s - 1] += b[p + q + ps + j];
		for (i = 0; i < q; ++i) {
			theta[(j + 1)*s + i] += b[i + p] * b[p + q + ps + j];
		}
	}
	
	/*
	if (obj->M == 1) {
		for (i = 0; i < N; ++i) {
			obj->x[offset + i] = obj->x[offset + 2 * N + i] - b[p + q + ps + qs];
		}
	}
	*/

	if (obj->M > 0) {
		for (i = 0; i < N; ++i) {
			temp = obj->x[offset + 2 * N + i];
			for(j = 0; j < M;++j) {
				temp -= reg[j*N+i]*b[naram+j];
			}
			obj->x[offset + i] = temp;
		}
	}
	
	iupd = 0;

	if ((ip == 1 && iq == 0) || (ip == 0 && iq == 0)) {
		*V = 1.0;
		*A = 0.0;
		*P = 1.0 / (1.0 - phi[0] * phi[0]);
	}
	else {
		iupd = 1;
		ifault = starma(ip, iq, phi, theta, A, P, V);
	}

	nit = 0;
	delta = 0.001;
	//mdisplay(P, 1, np);
	karma(ip, iq, phi, theta, A, P, V, N, obj->x + offset, obj->x + offset + N, &sumlog, &ssq, iupd, delta, &iter, &nit);
	obj->ssq = ssq;
	//mdisplay(V, 1, np);

	value = 0.5 * (sumlog / (double)iter + log(ssq / (double)iter));
	obj->loglik = value;
	//printf("sumlog ssq %g %g %d \n", sumlog,value,iter);

	free(phi);
	free(theta);
	free(A);
	free(P);
	free(V);
	return value;
}